

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# help.hpp
# Opt level: O0

void __thiscall Args::Help::process(Help *this,Context *context)

{
  bool bVar1;
  int iVar2;
  reference pbVar3;
  pointer pHVar4;
  undefined4 extraout_var;
  undefined8 uVar5;
  Arg *in_RDI;
  Command *cmd;
  bool printed;
  ArgIface *tmp;
  String arg;
  Context *in_stack_ffffffffffffff08;
  String *in_stack_ffffffffffffff10;
  Command *in_stack_ffffffffffffff18;
  ArgIface *pAVar6;
  Context *in_stack_ffffffffffffff20;
  ArgIface *in_stack_ffffffffffffff50;
  string local_88 [32];
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_68;
  ArgIface *local_60;
  byte local_51;
  ArgIface *local_50;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_38;
  string local_30 [48];
  
  bVar1 = Context::atEnd(in_stack_ffffffffffffff20);
  if (bVar1) {
    pHVar4 = std::unique_ptr<Args::HelpPrinterIface,_std::default_delete<Args::HelpPrinterIface>_>::
             operator->((unique_ptr<Args::HelpPrinterIface,_std::default_delete<Args::HelpPrinterIface>_>
                         *)0x13c82e);
    (*pHVar4->_vptr_HelpPrinterIface[2])(pHVar4,g_argsOutStream);
  }
  else {
    local_38._M_current =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         Context::next_abi_cxx11_(in_stack_ffffffffffffff08);
    pbVar3 = __gnu_cxx::
             __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator*(&local_38);
    std::__cxx11::string::string(local_30,(string *)pbVar3);
    bVar1 = details::isArgument((String *)0x13c48a);
    if ((bVar1) || (bVar1 = details::isFlag((String *)in_stack_ffffffffffffff08), bVar1)) {
      pHVar4 = std::unique_ptr<Args::HelpPrinterIface,_std::default_delete<Args::HelpPrinterIface>_>
               ::operator->((unique_ptr<Args::HelpPrinterIface,_std::default_delete<Args::HelpPrinterIface>_>
                             *)0x13c4c8);
      (*pHVar4->_vptr_HelpPrinterIface[3])(pHVar4,local_30,g_argsOutStream,0);
    }
    else {
      pHVar4 = std::unique_ptr<Args::HelpPrinterIface,_std::default_delete<Args::HelpPrinterIface>_>
               ::operator->((unique_ptr<Args::HelpPrinterIface,_std::default_delete<Args::HelpPrinterIface>_>
                             *)0x13c516);
      iVar2 = (*pHVar4->_vptr_HelpPrinterIface[8])(pHVar4,local_30);
      in_stack_ffffffffffffff50 = (ArgIface *)CONCAT44(extraout_var,iVar2);
      local_50 = in_stack_ffffffffffffff50;
      if ((in_stack_ffffffffffffff50 == (ArgIface *)0x0) ||
         (iVar2 = (*in_stack_ffffffffffffff50->_vptr_ArgIface[2])(), iVar2 != 0)) {
        pHVar4 = std::
                 unique_ptr<Args::HelpPrinterIface,_std::default_delete<Args::HelpPrinterIface>_>::
                 operator->((unique_ptr<Args::HelpPrinterIface,_std::default_delete<Args::HelpPrinterIface>_>
                             *)0x13c7e3);
        (*pHVar4->_vptr_HelpPrinterIface[2])(pHVar4,g_argsOutStream);
      }
      else {
        local_51 = 0;
        local_60 = local_50;
        while (bVar1 = Context::atEnd(in_stack_ffffffffffffff20), ((bVar1 ^ 0xffU) & 1) != 0) {
          local_68._M_current =
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               Context::next_abi_cxx11_(in_stack_ffffffffffffff08);
          pbVar3 = __gnu_cxx::
                   __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ::operator*(&local_68);
          std::__cxx11::string::operator=(local_30,(string *)pbVar3);
          if ((local_50 == (ArgIface *)0x0) ||
             (iVar2 = (*local_50->_vptr_ArgIface[2])(), iVar2 != 0)) break;
          local_60 = local_50;
          bVar1 = details::isArgument((String *)0x13c63b);
          if ((bVar1) || (bVar1 = details::isFlag((String *)in_stack_ffffffffffffff08), bVar1)) {
            pHVar4 = std::
                     unique_ptr<Args::HelpPrinterIface,_std::default_delete<Args::HelpPrinterIface>_>
                     ::operator->((unique_ptr<Args::HelpPrinterIface,_std::default_delete<Args::HelpPrinterIface>_>
                                   *)0x13c679);
            (*pHVar4->_vptr_HelpPrinterIface[3])(pHVar4,local_30,g_argsOutStream,local_60);
            local_51 = 1;
            break;
          }
          local_50 = Command::findChild(in_stack_ffffffffffffff18,in_stack_ffffffffffffff10);
        }
        if ((local_51 & 1) == 0) {
          if (local_50 == (ArgIface *)0x0) {
            pHVar4 = std::
                     unique_ptr<Args::HelpPrinterIface,_std::default_delete<Args::HelpPrinterIface>_>
                     ::operator->((unique_ptr<Args::HelpPrinterIface,_std::default_delete<Args::HelpPrinterIface>_>
                                   *)0x13c7b7);
            (*pHVar4->_vptr_HelpPrinterIface[2])(pHVar4,g_argsOutStream);
          }
          else {
            pHVar4 = std::
                     unique_ptr<Args::HelpPrinterIface,_std::default_delete<Args::HelpPrinterIface>_>
                     ::operator->((unique_ptr<Args::HelpPrinterIface,_std::default_delete<Args::HelpPrinterIface>_>
                                   *)0x13c708);
            (*local_50->_vptr_ArgIface[3])(local_88);
            pAVar6 = local_60;
            if (local_60 == local_50) {
              pAVar6 = (ArgIface *)0x0;
            }
            (*pHVar4->_vptr_HelpPrinterIface[3])(pHVar4,local_88,g_argsOutStream,pAVar6);
            std::__cxx11::string::~string(local_88);
          }
        }
      }
    }
    std::__cxx11::string::~string(local_30);
  }
  Arg::setDefined(in_RDI,true);
  if (((ulong)in_RDI[1].super_ArgIface.m_cmdLine & 1) == 0) {
    return;
  }
  uVar5 = __cxa_allocate_exception(0x30);
  HelpHasBeenPrintedException::HelpHasBeenPrintedException
            ((HelpHasBeenPrintedException *)in_stack_ffffffffffffff50);
  __cxa_throw(uVar5,&HelpHasBeenPrintedException::typeinfo,
              HelpHasBeenPrintedException::~HelpHasBeenPrintedException);
}

Assistant:

inline void
Help::process( Context & context )
{
	if( !context.atEnd() )
	{
		String arg = *context.next();

		// Argument or flag.
		if( details::isArgument( arg ) || details::isFlag( arg ) )
			m_printer->print( arg, g_argsOutStream );
		// Command?
		else
		{
			auto * tmp = m_printer->findArgument( arg );

			// Command.
			if( tmp && tmp->type() == ArgType::Command )
			{
				bool printed = false;

				auto * cmd = static_cast< Command* > ( tmp );

				while( !context.atEnd() )
				{
					arg = *context.next();

					if( tmp && tmp->type() == ArgType::Command )
					{
						cmd = static_cast< Command* > ( tmp );

						// Argument or flag.
						if( details::isArgument( arg ) || details::isFlag( arg ) )
						{
							m_printer->print( arg, g_argsOutStream, cmd );

							printed = true;

							break;
						}
						// Command?
						else
							tmp = cmd->findChild( arg );
					}
					else
						break;
				}

				if( !printed )
				{
					if( tmp )
						m_printer->print( tmp->name(), g_argsOutStream,
							( cmd != tmp ? cmd : nullptr ) );
					else
						m_printer->print( g_argsOutStream );
				}
			}
			else
				m_printer->print( g_argsOutStream );
		}
	}
	else
		m_printer->print( g_argsOutStream );

	setDefined( true );

	if( m_throwExceptionOnPrint )
		throw HelpHasBeenPrintedException();
}